

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

void __thiscall
cmCTestBZR::StatusParser::StatusParser(StatusParser *this,cmCTestBZR *bzr,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__StatusParser_00b39678;
  this->BZR = bzr;
  (this->RegexStatus).regmust = (char *)0x0;
  (this->RegexStatus).program = (char *)0x0;
  (this->RegexStatus).progsize = 0;
  memset(&this->RegexStatus,0,0x20a);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(bzr->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexStatus,"^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
  return;
}

Assistant:

StatusParser(cmCTestBZR* bzr, const char* prefix)
    : BZR(bzr)
  {
    this->SetLog(&bzr->Log, prefix);
    this->RegexStatus.compile("^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
  }